

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreCompare.cpp
# Opt level: O2

bool mathCore::is_CNF(expression *a)

{
  bool bVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  
  bVar1 = true;
  if ((a->FLAGS & 3U) == 0) {
    if ((a->FLAGS & 0x10U) == 0) {
      bVar1 = is_sum(a);
      return bVar1;
    }
    for (p_Var3 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar1 = (_Rb_tree_header *)p_Var3 == &(a->contents)._M_t._M_impl.super__Rb_tree_header,
        !bVar1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      bVar2 = is_sum(*(expression **)(p_Var3 + 1));
      if (!bVar2) {
        return bVar1;
      }
    }
  }
  return bVar1;
}

Assistant:

bool mathCore::is_var(expression* a) {
	return a->FLAGS & F_VAR;
}